

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# absRefSelect.c
# Opt level: O0

void Rnm_ManPrintSelected(Rnm_Man_t *p,Vec_Int_t *vNewPPis)

{
  Gia_Man_t *p_00;
  int iVar1;
  bool bVar2;
  uint local_28;
  int local_24;
  int Counter;
  int i;
  Gia_Obj_t *pObj;
  Vec_Int_t *vNewPPis_local;
  Rnm_Man_t *p_local;
  
  local_28 = 0;
  local_24 = 0;
  while( true ) {
    iVar1 = Vec_IntSize(p->vMap);
    bVar2 = false;
    if (local_24 < iVar1) {
      p_00 = p->pGia;
      iVar1 = Vec_IntEntry(p->vMap,local_24);
      _Counter = Gia_ManObj(p_00,iVar1);
      bVar2 = _Counter != (Gia_Obj_t *)0x0;
    }
    if (!bVar2) break;
    iVar1 = Gia_ObjIsPi(p->pGia,_Counter);
    if (iVar1 == 0) {
      iVar1 = Gia_ObjId(p->pGia,_Counter);
      iVar1 = Vec_IntFind(vNewPPis,iVar1);
      if (iVar1 < 0) {
        printf("0");
      }
      else {
        printf("1");
        local_28 = local_28 + 1;
      }
    }
    else {
      printf("-");
    }
    local_24 = local_24 + 1;
  }
  printf(" %3d\n",(ulong)local_28);
  return;
}

Assistant:

ABC_NAMESPACE_IMPL_START 

////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    []

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Rnm_ManPrintSelected( Rnm_Man_t * p, Vec_Int_t * vNewPPis )
{
    Gia_Obj_t * pObj;
    int i, Counter = 0;
    Gia_ManForEachObjVec( p->vMap, p->pGia, pObj, i )
        if ( Gia_ObjIsPi(p->pGia, pObj) ) 
            printf( "-" );
        else if ( Vec_IntFind(vNewPPis, Gia_ObjId(p->pGia, pObj)) >= 0 )// this is PPI
            printf( "1" ), Counter++;
        else
            printf( "0" );
    printf( " %3d\n", Counter );
}